

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::ShaderEvalContext::ShaderEvalContext(ShaderEvalContext *this,QuadGrid *quadGrid_)

{
  Type TVar1;
  Vec4 *v;
  vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_> *this_00;
  size_type sVar2;
  const_reference this_01;
  Sampler *pSVar3;
  Texture2D *this_02;
  Texture2D *pTVar4;
  TextureCube *this_03;
  TextureCube *pTVar5;
  Texture2DArray *this_04;
  Texture2DArray *pTVar6;
  Texture3D *this_05;
  Texture3D *pTVar7;
  ShaderSampler *local_60;
  Vec4 *local_38;
  TextureBinding *binding;
  int ndx;
  vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_> *bindings;
  QuadGrid *quadGrid__local;
  ShaderEvalContext *this_local;
  
  tcu::Vector<float,_4>::Vector(&this->coords);
  tcu::Vector<float,_4>::Vector(&this->unitCoords);
  v = QuadGrid::getConstCoords(quadGrid_);
  tcu::Vector<float,_4>::Vector(&this->constCoords,v);
  local_38 = this->in;
  do {
    tcu::Vector<float,_4>::Vector(local_38);
    local_38 = local_38 + 1;
  } while ((ShaderSampler *)local_38 != this->textures);
  local_60 = this->textures;
  do {
    ShaderSampler::ShaderSampler(local_60);
    local_60 = local_60 + 1;
  } while (local_60 != (ShaderSampler *)&this->color);
  tcu::Vector<float,_4>::Vector(&this->color);
  this->isDiscarded = false;
  this->quadGrid = quadGrid_;
  this_00 = QuadGrid::getTextures(this->quadGrid);
  for (binding._4_4_ = 0;
      sVar2 = std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::
              size(this_00), binding._4_4_ < (int)sVar2; binding._4_4_ = binding._4_4_ + 1) {
    this_01 = std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::
              operator[](this_00,(long)binding._4_4_);
    TVar1 = TextureBinding::getType(this_01);
    if (TVar1 != TYPE_NONE) {
      pSVar3 = TextureBinding::getSampler(this_01);
      tcu::Sampler::operator=(&this->textures[binding._4_4_].sampler,pSVar3);
      TVar1 = TextureBinding::getType(this_01);
      switch(TVar1) {
      case TYPE_2D:
        this_02 = TextureBinding::get2D(this_01);
        pTVar4 = glu::Texture2D::getRefTexture(this_02);
        this->textures[binding._4_4_].tex2D = pTVar4;
        break;
      case TYPE_CUBE_MAP:
        this_03 = TextureBinding::getCube(this_01);
        pTVar5 = glu::TextureCube::getRefTexture(this_03);
        this->textures[binding._4_4_].texCube = pTVar5;
        break;
      case TYPE_2D_ARRAY:
        this_04 = TextureBinding::get2DArray(this_01);
        pTVar6 = glu::Texture2DArray::getRefTexture(this_04);
        this->textures[binding._4_4_].tex2DArray = pTVar6;
        break;
      case TYPE_3D:
        this_05 = TextureBinding::get3D(this_01);
        pTVar7 = glu::Texture3D::getRefTexture(this_05);
        this->textures[binding._4_4_].tex3D = pTVar7;
      }
    }
  }
  return;
}

Assistant:

ShaderEvalContext::ShaderEvalContext (const QuadGrid& quadGrid_)
	: constCoords	(quadGrid_.getConstCoords())
	, isDiscarded	(false)
	, quadGrid		(quadGrid_)
{
	const vector<TextureBinding>& bindings = quadGrid.getTextures();
	DE_ASSERT((int)bindings.size() <= MAX_TEXTURES);

	// Fill in texture array.
	for (int ndx = 0; ndx < (int)bindings.size(); ndx++)
	{
		const TextureBinding& binding = bindings[ndx];

		if (binding.getType() == TextureBinding::TYPE_NONE)
			continue;

		textures[ndx].sampler = binding.getSampler();

		switch (binding.getType())
		{
			case TextureBinding::TYPE_2D:		textures[ndx].tex2D			= &binding.get2D()->getRefTexture();		break;
			case TextureBinding::TYPE_CUBE_MAP:	textures[ndx].texCube		= &binding.getCube()->getRefTexture();		break;
			case TextureBinding::TYPE_2D_ARRAY:	textures[ndx].tex2DArray	= &binding.get2DArray()->getRefTexture();	break;
			case TextureBinding::TYPE_3D:		textures[ndx].tex3D			= &binding.get3D()->getRefTexture();		break;
			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}